

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log2asc.c
# Opt level: O3

void print_usage(char *prg)

{
  fprintf(_stderr,"%s - convert compact CAN frame logfile to ASC logfile.\n",prg);
  fprintf(_stderr,"Usage: %s <options> [can-interfaces]\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -I <infile>   (default stdin)\n",0x27,1,_stderr);
  fwrite("         -O <outfile>  (default stdout)\n",0x28,1,_stderr);
  fwrite("         -4  (reduce decimal place to 4 digits)\n",0x30,1,_stderr);
  fwrite("         -n  (set newline to cr/lf - default lf)\n",0x31,1,_stderr);
  fwrite("         -f  (use CANFD format also for CAN CC)\n",0x30,1,_stderr);
  fwrite("         -x  (use CANXL format also for CAN CC/FD)\n",0x33,1,_stderr);
  fwrite("         -r  (suppress dlc for RTR frames - pre v8.5 tools)\n",0x3c,1,_stderr);
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - convert compact CAN frame logfile to ASC logfile.\n", prg);
	fprintf(stderr, "Usage: %s <options> [can-interfaces]\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -I <infile>   (default stdin)\n");
	fprintf(stderr, "         -O <outfile>  (default stdout)\n");
	fprintf(stderr, "         -4  (reduce decimal place to 4 digits)\n");
	fprintf(stderr, "         -n  (set newline to cr/lf - default lf)\n");
	fprintf(stderr, "         -f  (use CANFD format also for CAN CC)\n");
	fprintf(stderr, "         -x  (use CANXL format also for CAN CC/FD)\n");
	fprintf(stderr, "         -r  (suppress dlc for RTR frames - pre v8.5 tools)\n");
}